

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

double waitforflags(int *ptr1,int *ptr2)

{
  int i;
  int iVar1;
  double in_XMM0_Qa;
  double dVar2;
  
  iVar1 = 1;
  while ((*ptr1 == 0 || (*ptr2 == 0))) {
    dVar2 = (double)iVar1;
    iVar1 = iVar1 + 1;
    in_XMM0_Qa = exp(-dVar2);
  }
  return in_XMM0_Qa;
}

Assistant:

static inline double waitforflags (int *ptr1, int *ptr2)
{
  int i = 1;
  double val = 0;
  while (*ptr1 ==  0 || *ptr2 == 0) {
    val = exp(-(double)i++);
  }
#if 0
  printf("%d: flags set at %p and %p\n",GAme,ptr1,ptr2); fflush(stdout);
#endif
  return(val);
}